

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O1

void __thiscall SQASTWriter::writeOptions(SQASTWriter *this)

{
  (**this->stream->_vptr_OutputStream)(this->stream,1);
  (**this->stream->_vptr_OutputStream)(this->stream,1);
  (**this->stream->_vptr_OutputStream)(this->stream,8);
  (**this->stream->_vptr_OutputStream)(this->stream,4);
  return;
}

Assistant:

void SQASTWriter::writeOptions() {
  stream->writeInt8(VERSION);
  stream->writeInt8(OP_DELTA);
  stream->writeInt8(sizeof(SQInteger));
  stream->writeInt8(sizeof(SQFloat));
}